

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O0

WORD32 ihevc_dpb_mgr_insert_ref(dpb_mgr_t *ps_dpb_mgr,pic_buf_t *ps_pic_buf,WORD32 buf_id)

{
  dpb_info_t *ps_dpb_info;
  int i;
  WORD32 buf_id_local;
  pic_buf_t *ps_pic_buf_local;
  dpb_mgr_t *ps_dpb_mgr_local;
  WORD32 local_4;
  
  i = 0;
  while( true ) {
    if (0x3f < i) {
      i = 0;
      while ((i < 0x40 && (ps_dpb_mgr->as_dpb_info[i].ps_pic_buf != (pic_buf_t *)0x0))) {
        i = i + 1;
      }
      if (i == 0x40) {
        local_4 = -1;
      }
      else {
        ps_dpb_mgr->as_dpb_info[i].ps_pic_buf = ps_pic_buf;
        ps_dpb_mgr->as_dpb_info[i].ps_prev_dpb = ps_dpb_mgr->ps_dpb_head;
        (ps_dpb_mgr->as_dpb_info[i].ps_pic_buf)->u1_buf_id = (UWORD8)buf_id;
        (ps_dpb_mgr->as_dpb_info[i].ps_pic_buf)->u1_used_as_ref = '\x02';
        ps_dpb_mgr->ps_dpb_head = ps_dpb_mgr->as_dpb_info + i;
        ps_dpb_mgr->u1_num_ref_bufs = ps_dpb_mgr->u1_num_ref_bufs + '\x01';
        local_4 = 0;
      }
      return local_4;
    }
    if ((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf == ps_pic_buf) &&
       ((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf)->u1_used_as_ref != '\0')) break;
    i = i + 1;
  }
  return -1;
}

Assistant:

WORD32 ihevc_dpb_mgr_insert_ref(dpb_mgr_t *ps_dpb_mgr,
                                pic_buf_t *ps_pic_buf,
                                WORD32 buf_id)
{
    int i;
    dpb_info_t *ps_dpb_info;

    ps_dpb_info = ps_dpb_mgr->as_dpb_info;

    /* Return error if buffer is already present in the DPB */
    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if((ps_dpb_info[i].ps_pic_buf == ps_pic_buf)
                        && (ps_dpb_info[i].ps_pic_buf->u1_used_as_ref))
        {
            return (-1);
        }


    }

    /* Find an unused DPB location */
    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if(NULL == ps_dpb_info[i].ps_pic_buf)
        {
            break;
        }
    }
    if(i == MAX_DPB_BUFS)
    {
        return (-1);
    }

    /* Create DPB info */
    ps_dpb_info[i].ps_pic_buf = ps_pic_buf;
    ps_dpb_info[i].ps_prev_dpb = ps_dpb_mgr->ps_dpb_head;
    ps_dpb_info[i].ps_pic_buf->u1_buf_id = buf_id;
    ps_dpb_info[i].ps_pic_buf->u1_used_as_ref = SHORT_TERM_REF;

    /* update the head node of linked list to point to the current picture */
    ps_dpb_mgr->ps_dpb_head = ps_dpb_info + i;

    /* Increment Short term buffer count */
    ps_dpb_mgr->u1_num_ref_bufs++;

    return 0;
}